

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O0

size_t bssl::ssl_ech_confirmation_signal_hello_offset(SSL *ssl)

{
  int iVar1;
  int iVar2;
  size_t header_len;
  SSL *ssl_local;
  
  iVar1 = SSL_is_dtls(ssl);
  iVar2 = 4;
  if (iVar1 != 0) {
    iVar2 = 0xc;
  }
  return (long)iVar2 + 0x1a;
}

Assistant:

size_t ssl_ech_confirmation_signal_hello_offset(const SSL *ssl) {
  static_assert(ECH_CONFIRMATION_SIGNAL_LEN < SSL3_RANDOM_SIZE,
                "the confirmation signal is a suffix of the random");
  const size_t header_len =
      SSL_is_dtls(ssl) ? DTLS1_HM_HEADER_LENGTH : SSL3_HM_HEADER_LENGTH;
  return header_len + 2 /* version */ + SSL3_RANDOM_SIZE -
         ECH_CONFIRMATION_SIGNAL_LEN;
}